

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ResolveSelfReference(Parse *pParse,Table *pTab,int type,Expr *pExpr,ExprList *pList)

{
  int iVar1;
  undefined1 local_e0 [8];
  NameContext sNC;
  SrcList sSrc;
  ExprList *pList_local;
  Expr *pExpr_local;
  int type_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  memset(local_e0,0,0x38);
  memset(&sNC.ncFlags,0,0x78);
  sNC.ncFlags = 1;
  sNC._50_2_ = 0;
  sNC.pParse = (Parse *)&sNC.ncFlags;
  sNC.nRef._0_2_ = (undefined2)type;
  local_e0 = (undefined1  [8])pParse;
  iVar1 = sqlite3ResolveExprNames((NameContext *)local_e0,pExpr);
  if ((iVar1 == 0) && (pList != (ExprList *)0x0)) {
    sqlite3ResolveExprListNames((NameContext *)local_e0,pList);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResolveSelfReference(
  Parse *pParse,      /* Parsing context */
  Table *pTab,        /* The table being referenced */
  int type,           /* NC_IsCheck or NC_PartIdx or NC_IdxExpr */
  Expr *pExpr,        /* Expression to resolve.  May be NULL. */
  ExprList *pList     /* Expression list to resolve.  May be NUL. */
){
  SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
  NameContext sNC;                /* Name context for pParse->pNewTable */

  assert( type==NC_IsCheck || type==NC_PartIdx || type==NC_IdxExpr );
  memset(&sNC, 0, sizeof(sNC));
  memset(&sSrc, 0, sizeof(sSrc));
  sSrc.nSrc = 1;
  sSrc.a[0].zName = pTab->zName;
  sSrc.a[0].pTab = pTab;
  sSrc.a[0].iCursor = -1;
  sNC.pParse = pParse;
  sNC.pSrcList = &sSrc;
  sNC.ncFlags = type;
  if( sqlite3ResolveExprNames(&sNC, pExpr) ) return;
  if( pList ) sqlite3ResolveExprListNames(&sNC, pList);
}